

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

void __thiscall CLPIParser::parseExtensionData(CLPIParser *this,uint8_t *buffer,uint8_t *end)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint dataLength;
  ostream *poVar4;
  bool bVar5;
  int local_60;
  BitStreamReader reader;
  
  reader.super_BitStream.m_totalBits = 0;
  reader.super_BitStream.m_buffer = (uint *)0x0;
  reader.super_BitStream.m_initBuffer = (uint *)0x0;
  reader.m_curVal = 0;
  reader.m_bitLeft = 0;
  BitStreamReader::setBuffer(&reader,buffer,end);
  uVar1 = BitStreamReader::getBits(&reader,0x20);
  if (uVar1 != 0) {
    BitStreamReader::skipBits(&reader,0x20);
    BitStreamReader::skipBits(&reader,0x18);
    uVar2 = BitStreamReader::getBits(&reader,8);
    local_60 = (int)buffer;
    uVar1 = 0;
    if (0 < (int)uVar2) {
      uVar1 = uVar2;
    }
    while (bVar5 = uVar1 != 0, uVar1 = uVar1 - 1, bVar5) {
      uVar2 = BitStreamReader::getBits(&reader,0x20);
      uVar3 = BitStreamReader::getBits(&reader,0x20);
      dataLength = BitStreamReader::getBits(&reader,0x20);
      if ((uint)((int)end - local_60) < dataLength + uVar3) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Invalid extended clip info entry skipped.");
        std::endl<char,std::char_traits<char>>(poVar4);
        sLastMsg = true;
      }
      else if (uVar2 == 0x20006) {
        parseCPI(buffer + uVar3,buffer + uVar3 + dataLength);
      }
      else if (uVar2 == 0x20005) {
        ProgramInfo_SS(this,buffer + uVar3,dataLength);
      }
      else if (uVar2 == 0x20004) {
        Extent_Start_Point(this,buffer + uVar3,dataLength);
      }
    }
  }
  return;
}

Assistant:

void CLPIParser::parseExtensionData(uint8_t* buffer, const uint8_t* end)
{
    // added for 3D compatibility
    BitStreamReader reader{};
    reader.setBuffer(buffer, end);
    if (reader.getBits(32) == 0)  // length
        return;

    reader.skipBits(32);  // data_block_start_address
    reader.skipBits(24);
    const int entries = reader.getBits<int>(8);
    for (int i = 0; i < entries; ++i)
    {
        const uint32_t dataID = reader.getBits(32);
        const uint32_t dataAddress = reader.getBits(32);
        const uint32_t dataLength = reader.getBits(32);

        if (dataAddress + dataLength > static_cast<uint32_t>(end - buffer))
        {
            LTRACE(LT_WARN, 2, "Invalid extended clip info entry skipped.");
            continue;
        }

        switch (dataID)
        {
        case 0x00010002:
            HDMV_LPCM_down_mix_coefficient(buffer + dataAddress, dataLength);
            break;
        case 0x00020004:
            Extent_Start_Point(buffer + dataAddress, dataLength);
            break;
        case 0x00020005:
            ProgramInfo_SS(buffer + dataAddress, dataLength);
            break;
        case 0x00020006:
            CPI_SS(buffer + dataAddress, dataLength);
            break;
        default:;
        }
    }
}